

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O2

int __thiscall
ncnn::GRU::forward(GRU *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  void *__src;
  void *__dest;
  Mat m;
  Mat m_8;
  Mat m_7;
  Mat local_1a8;
  Mat m_6;
  Mat m_2;
  Mat m_1;
  Mat m_14;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0x90];
  iVar5 = -100;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0x90) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0x90,_allocator);
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          free(local_1a8.data);
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_1a8.data = m.data;
    local_1a8.refcount._0_4_ = m.refcount._0_4_;
    local_1a8.refcount._4_4_ = m.refcount._4_4_;
    local_1a8.elemsize._0_4_ = (undefined4)m.elemsize;
    local_1a8.elemsize._4_4_ = m.elemsize._4_4_;
    local_1a8.elempack = m.elempack;
    local_1a8.allocator = m.allocator;
    local_1a8.dims = m.dims;
    local_1a8.w = m.w;
    local_1a8.h = m.h;
    local_1a8.d = m.d;
    local_1a8.c = m.c;
    local_1a8.cstep = m.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::create(&local_1a8,this->num_output,(iVar1 == 2) + 1,4,_allocator);
    if (local_1a8.data == (void *)0x0) goto LAB_004b3850;
    if (local_1a8.cstep * (long)local_1a8.c == 0) goto LAB_004b3850;
    uVar7 = (int)local_1a8.cstep * local_1a8.c;
    uVar9 = 0;
    uVar6 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar6 = uVar9;
    }
    for (; (int)uVar6 != (int)uVar9; uVar9 = uVar9 + 1) {
      *(undefined4 *)((long)local_1a8.data + uVar9 * 4) = 0;
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar7 = this->direction;
    if (uVar7 < 2) {
      if (this->int8_scale_term == 0) {
        m.w = (this->weight_xc_data).w;
        m.h = (this->weight_xc_data).h;
        m.data = (this->weight_xc_data).data;
        uVar6 = (this->weight_xc_data).elemsize;
        m.elempack = (this->weight_xc_data).elempack;
        m.allocator = (this->weight_xc_data).allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar6;
        m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m.c = (this->weight_xc_data).d;
        m.d = 1;
        iVar1 = (this->weight_xc_data).dims;
        m.dims = iVar1 + -1;
        m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = (this->bias_c_data).w;
        m_1.h = (this->bias_c_data).h;
        m_1.data = (this->bias_c_data).data;
        uVar6 = (this->bias_c_data).elemsize;
        m_1.elempack = (this->bias_c_data).elempack;
        m_1.allocator = (this->bias_c_data).allocator;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar6;
        m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_1.c = (this->bias_c_data).d;
        m_1.d = 1;
        iVar1 = (this->bias_c_data).dims;
        m_1.dims = iVar1 + -1;
        m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.w = (this->weight_hc_data).w;
        m_2.h = (this->weight_hc_data).h;
        m_2.c = (this->weight_hc_data).d;
        m_2.data = (this->weight_hc_data).data;
        m_2.elemsize = (this->weight_hc_data).elemsize;
        m_2.elempack = (this->weight_hc_data).elempack;
        m_2.allocator = (this->weight_hc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.d = 1;
        sVar8 = (long)m_2.h * (long)m_2.w;
        iVar1 = (this->weight_hc_data).dims;
        m_2.dims = iVar1 + -1;
        m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
        if (iVar1 == 4) {
          m_2.cstep = sVar8;
        }
        iVar5 = gru(bottom_blob,this_00,uVar7,&m,&m_1,&m_2,&local_1a8,opt);
      }
      else {
        m.w = (this->weight_xc_data).w;
        m.h = (this->weight_xc_data).h;
        m.data = (this->weight_xc_data).data;
        uVar6 = (this->weight_xc_data).elemsize;
        m.elempack = (this->weight_xc_data).elempack;
        m.allocator = (this->weight_xc_data).allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar6;
        m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m.c = (this->weight_xc_data).d;
        m.d = 1;
        iVar1 = (this->weight_xc_data).dims;
        m.dims = iVar1 + -1;
        m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        m_1.w = (this->bias_c_data).w;
        m_1.h = (this->bias_c_data).h;
        m_1.data = (this->bias_c_data).data;
        uVar6 = (this->bias_c_data).elemsize;
        m_1.elempack = (this->bias_c_data).elempack;
        m_1.allocator = (this->bias_c_data).allocator;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = (undefined4)uVar6;
        m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_1.c = (this->bias_c_data).d;
        m_1.d = 1;
        iVar1 = (this->bias_c_data).dims;
        m_1.dims = iVar1 + -1;
        m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar1 == 4) {
          m_1.cstep = (long)m_1.h * (long)m_1.w;
        }
        m_2.w = (this->weight_hc_data).w;
        m_2.h = (this->weight_hc_data).h;
        m_2.c = (this->weight_hc_data).d;
        m_2.data = (this->weight_hc_data).data;
        m_2.elemsize = (this->weight_hc_data).elemsize;
        m_2.elempack = (this->weight_hc_data).elempack;
        m_2.allocator = (this->weight_hc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.d = 1;
        sVar8 = (long)m_2.h * (long)m_2.w;
        iVar1 = (this->weight_hc_data).dims;
        m_2.dims = iVar1 + -1;
        m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
        if (iVar1 == 4) {
          m_2.cstep = sVar8;
        }
        iVar5 = gru_int8(bottom_blob,this_00,uVar7,&m,
                         (float *)(this->weight_xc_data_int8_scales).data,&m_1,&m_2,
                         (float *)(this->weight_hc_data_int8_scales).data,&local_1a8,opt);
      }
      if (iVar5 != 0) goto LAB_004b3850;
      uVar7 = this->direction;
    }
    if (uVar7 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
      iVar5 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar4 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
        iVar5 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar4 = false;
        }
        else {
          m_2.cstep = (size_t)local_1a8.w;
          m_2.elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
          m_2.data = local_1a8.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_1a8.elempack;
          m_2.allocator = local_1a8.allocator;
          m_2.dims = 2;
          m_2.w = local_1a8.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          if (this->int8_scale_term == 0) {
            m_6.w = (this->weight_xc_data).w;
            m_6.h = (this->weight_xc_data).h;
            m_6.c = (this->weight_xc_data).d;
            m_6.data = (this->weight_xc_data).data;
            m_6.elemsize = (this->weight_xc_data).elemsize;
            m_6.elempack = (this->weight_xc_data).elempack;
            m_6.allocator = (this->weight_xc_data).allocator;
            m_6.refcount = (int *)0x0;
            m_6.d = 1;
            sVar8 = (long)m_6.h * (long)m_6.w;
            iVar1 = (this->weight_xc_data).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (m_6.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_6.elemsize;
            if (iVar1 == 4) {
              m_6.cstep = sVar8;
            }
            m_7.w = (this->bias_c_data).w;
            m_7.h = (this->bias_c_data).h;
            m_7.c = (this->bias_c_data).d;
            m_7.data = (this->bias_c_data).data;
            m_7.elemsize = (this->bias_c_data).elemsize;
            m_7.elempack = (this->bias_c_data).elempack;
            m_7.allocator = (this->bias_c_data).allocator;
            m_7.refcount = (int *)0x0;
            m_7.d = 1;
            iVar1 = (this->bias_c_data).dims;
            m_7.dims = iVar1 + -1;
            m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                        m_7.elemsize;
            if (iVar1 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
            m_8.w = (this->weight_hc_data).w;
            m_8.h = (this->weight_hc_data).h;
            m_8.c = (this->weight_hc_data).d;
            m_8.data = (this->weight_hc_data).data;
            m_8.elemsize = (this->weight_hc_data).elemsize;
            m_8.elempack = (this->weight_hc_data).elempack;
            m_8.allocator = (this->weight_hc_data).allocator;
            m_8.refcount = (int *)0x0;
            m_8.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_8.dims = iVar1 + -1;
            m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                        m_8.elemsize;
            if (iVar1 == 4) {
              m_8.cstep = (long)m_8.h * (long)m_8.w;
            }
            iVar5 = gru(bottom_blob,&m,0,&m_6,&m_7,&m_8,&m_2,opt);
          }
          else {
            m_6.w = (this->weight_xc_data).w;
            m_6.h = (this->weight_xc_data).h;
            m_6.c = (this->weight_xc_data).d;
            m_6.data = (this->weight_xc_data).data;
            m_6.elemsize = (this->weight_xc_data).elemsize;
            m_6.elempack = (this->weight_xc_data).elempack;
            m_6.allocator = (this->weight_xc_data).allocator;
            m_6.refcount = (int *)0x0;
            m_6.d = 1;
            sVar8 = (long)m_6.h * (long)m_6.w;
            iVar1 = (this->weight_xc_data).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (m_6.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_6.elemsize;
            if (iVar1 == 4) {
              m_6.cstep = sVar8;
            }
            m_7.w = (this->bias_c_data).w;
            m_7.h = (this->bias_c_data).h;
            m_7.c = (this->bias_c_data).d;
            m_7.data = (this->bias_c_data).data;
            m_7.elemsize = (this->bias_c_data).elemsize;
            m_7.elempack = (this->bias_c_data).elempack;
            m_7.allocator = (this->bias_c_data).allocator;
            m_7.refcount = (int *)0x0;
            m_7.d = 1;
            iVar1 = (this->bias_c_data).dims;
            m_7.dims = iVar1 + -1;
            m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                        m_7.elemsize;
            if (iVar1 == 4) {
              m_7.cstep = (long)m_7.h * (long)m_7.w;
            }
            m_8.w = (this->weight_hc_data).w;
            m_8.h = (this->weight_hc_data).h;
            m_8.c = (this->weight_hc_data).d;
            m_8.data = (this->weight_hc_data).data;
            m_8.elemsize = (this->weight_hc_data).elemsize;
            m_8.elempack = (this->weight_hc_data).elempack;
            m_8.allocator = (this->weight_hc_data).allocator;
            m_8.refcount = (int *)0x0;
            m_8.d = 1;
            iVar1 = (this->weight_hc_data).dims;
            m_8.dims = iVar1 + -1;
            m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                        m_8.elemsize;
            if (iVar1 == 4) {
              m_8.cstep = (long)m_8.h * (long)m_8.w;
            }
            iVar5 = gru_int8(bottom_blob,&m,0,&m_6,(float *)(this->weight_xc_data_int8_scales).data,
                             &m_7,&m_8,(float *)(this->weight_hc_data_int8_scales).data,&m_2,opt);
          }
          if (iVar5 == 0) {
            m_6.cstep = (size_t)local_1a8.w;
            m_6.elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
            m_6.data = (void *)(m_6.elemsize * m_6.cstep + (long)local_1a8.data);
            m_6.refcount = (int *)0x0;
            m_6.elempack = local_1a8.elempack;
            m_6.allocator = local_1a8.allocator;
            m_6.dims = 2;
            m_6.w = local_1a8.w;
            m_6.h = 1;
            m_6.d = 1;
            m_6.c = 1;
            if (this->int8_scale_term == 0) {
              m_7.w = (this->weight_xc_data).w;
              m_7.h = (this->weight_xc_data).h;
              m_7.elemsize = (this->weight_xc_data).elemsize;
              m_7.data = (void *)((this->weight_xc_data).cstep * m_7.elemsize +
                                 (long)(this->weight_xc_data).data);
              m_7.c = (this->weight_xc_data).d;
              m_7.elempack = (this->weight_xc_data).elempack;
              m_7.allocator = (this->weight_xc_data).allocator;
              m_7.refcount = (int *)0x0;
              m_7.d = 1;
              iVar1 = (this->weight_xc_data).dims;
              m_7.dims = iVar1 + -1;
              m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                          m_7.elemsize;
              if (iVar1 == 4) {
                m_7.cstep = (long)m_7.h * (long)m_7.w;
              }
              m_8.w = (this->bias_c_data).w;
              m_8.h = (this->bias_c_data).h;
              m_8.elemsize = (this->bias_c_data).elemsize;
              m_8.data = (void *)((this->bias_c_data).cstep * m_8.elemsize +
                                 (long)(this->bias_c_data).data);
              m_8.c = (this->bias_c_data).d;
              m_8.elempack = (this->bias_c_data).elempack;
              m_8.allocator = (this->bias_c_data).allocator;
              m_8.refcount = (int *)0x0;
              m_8.d = 1;
              iVar1 = (this->bias_c_data).dims;
              m_8.dims = iVar1 + -1;
              m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                          m_8.elemsize;
              if (iVar1 == 4) {
                m_8.cstep = (long)m_8.h * (long)m_8.w;
              }
              m_14.w = (this->weight_hc_data).w;
              m_14.h = (this->weight_hc_data).h;
              m_14.elemsize = (this->weight_hc_data).elemsize;
              m_14.data = (void *)((this->weight_hc_data).cstep * m_14.elemsize +
                                  (long)(this->weight_hc_data).data);
              m_14.c = (this->weight_hc_data).d;
              m_14.elempack = (this->weight_hc_data).elempack;
              m_14.allocator = (this->weight_hc_data).allocator;
              m_14.refcount = (int *)0x0;
              m_14.d = 1;
              iVar1 = (this->weight_hc_data).dims;
              m_14.dims = iVar1 + -1;
              m_14.cstep = (m_14.elemsize * (long)m_14.h * (long)m_14.w + 0xf & 0xfffffffffffffff0)
                           / m_14.elemsize;
              if (iVar1 == 4) {
                m_14.cstep = (long)m_14.h * (long)m_14.w;
              }
              iVar5 = gru(bottom_blob,&m_1,1,&m_7,&m_8,&m_14,&m_6,opt);
            }
            else {
              m_7.w = (this->weight_xc_data).w;
              m_7.h = (this->weight_xc_data).h;
              m_7.elemsize = (this->weight_xc_data).elemsize;
              m_7.data = (void *)((this->weight_xc_data).cstep * m_7.elemsize +
                                 (long)(this->weight_xc_data).data);
              m_7.c = (this->weight_xc_data).d;
              m_7.elempack = (this->weight_xc_data).elempack;
              m_7.allocator = (this->weight_xc_data).allocator;
              m_7.refcount = (int *)0x0;
              m_7.d = 1;
              iVar1 = (this->weight_xc_data).dims;
              m_7.dims = iVar1 + -1;
              m_7.cstep = (m_7.elemsize * (long)m_7.h * (long)m_7.w + 0xf & 0xfffffffffffffff0) /
                          m_7.elemsize;
              if (iVar1 == 4) {
                m_7.cstep = (long)m_7.h * (long)m_7.w;
              }
              m_8.w = (this->bias_c_data).w;
              m_8.h = (this->bias_c_data).h;
              m_8.elemsize = (this->bias_c_data).elemsize;
              m_8.data = (void *)((this->bias_c_data).cstep * m_8.elemsize +
                                 (long)(this->bias_c_data).data);
              m_8.c = (this->bias_c_data).d;
              m_8.elempack = (this->bias_c_data).elempack;
              m_8.allocator = (this->bias_c_data).allocator;
              m_8.refcount = (int *)0x0;
              m_8.d = 1;
              iVar1 = (this->bias_c_data).dims;
              m_8.dims = iVar1 + -1;
              m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                          m_8.elemsize;
              if (iVar1 == 4) {
                m_8.cstep = (long)m_8.h * (long)m_8.w;
              }
              m_14.w = (this->weight_hc_data).w;
              m_14.h = (this->weight_hc_data).h;
              m_14.elemsize = (this->weight_hc_data).elemsize;
              m_14.data = (void *)((this->weight_hc_data).cstep * m_14.elemsize +
                                  (long)(this->weight_hc_data).data);
              m_14.c = (this->weight_hc_data).d;
              m_14.elempack = (this->weight_hc_data).elempack;
              m_14.allocator = (this->weight_hc_data).allocator;
              m_14.refcount = (int *)0x0;
              m_14.d = 1;
              iVar1 = (this->weight_hc_data).dims;
              m_14.dims = iVar1 + -1;
              m_14.cstep = (m_14.elemsize * (long)m_14.h * (long)m_14.w + 0xf & 0xfffffffffffffff0)
                           / m_14.elemsize;
              if (iVar1 == 4) {
                m_14.cstep = (long)m_14.h * (long)m_14.w;
              }
              iVar5 = gru_int8(bottom_blob,&m_1,1,&m_7,
                               (float *)((long)(this->weight_xc_data_int8_scales).w *
                                         (this->weight_xc_data_int8_scales).elemsize +
                                        (long)(this->weight_xc_data_int8_scales).data),&m_8,&m_14,
                               (float *)((long)(this->weight_hc_data_int8_scales).w *
                                         (this->weight_hc_data_int8_scales).elemsize +
                                        (long)(this->weight_hc_data_int8_scales).data),&m_6,opt);
            }
            if (iVar5 == 0) {
              iVar5 = 0;
              uVar6 = (ulong)_h;
              if ((int)_h < 1) {
                uVar6 = 0;
              }
              for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
                __src = (void *)((long)m_1.w * uVar9 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar9 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar9 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                       (long)this->num_output << 2);
              }
              bVar4 = true;
            }
            else {
              bVar4 = false;
            }
            if (m_6.refcount != (int *)0x0) {
              LOCK();
              *m_6.refcount = *m_6.refcount + -1;
              UNLOCK();
              if (*m_6.refcount == 0) {
                if (m_6.allocator == (Allocator *)0x0) {
                  free(m_6.data);
                }
                else {
                  (*(m_6.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar4 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                free(m_2.data);
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar4) goto LAB_004b3850;
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0;
    if (((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pMVar2 == 0x90) &&
       (pMVar2 + 1 != &local_1a8)) {
      piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = pMVar2[1].refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pMVar2[1].allocator == (Allocator *)0x0) {
            free(pMVar2[1].data);
          }
          else {
            (*(pMVar2[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar2[1].data = local_1a8.data;
      pMVar2[1].refcount = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      pMVar2[1].elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
      pMVar2[1].elempack = local_1a8.elempack;
      pMVar2[1].allocator = local_1a8.allocator;
      pMVar2[1].dims = local_1a8.dims;
      pMVar2[1].w = local_1a8.w;
      pMVar2[1].h = local_1a8.h;
      pMVar2[1].d = local_1a8.d;
      pMVar2[1].c = local_1a8.c;
      pMVar2[1].cstep = local_1a8.cstep;
    }
  }
LAB_004b3850:
  piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        free(local_1a8.data);
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int GRU::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = gru_int8(bottom_blob, top_blob, direction, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), hidden, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = gru(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
            if (ret != 0)
                return ret;
        }
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = gru_int8(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), weight_xc_data_int8_scales.row(0), bias_c_data.channel(0), weight_hc_data.channel(0), weight_hc_data_int8_scales.row(0), hidden0, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = gru(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
#if NCNN_INT8
        if (int8_scale_term)
        {
            int ret = gru_int8(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), weight_xc_data_int8_scales.row(1), bias_c_data.channel(1), weight_hc_data.channel(1), weight_hc_data_int8_scales.row(1), hidden1, opt);
            if (ret != 0)
                return ret;
        }
        else
#endif
        {
            int ret = gru(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}